

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  anon_union_264_9_0449b319_for_proto *pp;
  undefined4 *puVar1;
  curl_slist *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  char *pcVar5;
  _Bool *p_Var6;
  char *pcVar7;
  bool bVar8;
  SessionHandle *pSVar9;
  char *local_48;
  
  *done = false;
  pSVar9 = conn->data;
  pcVar7 = (pSVar9->set).str[4];
  if (pcVar7 != (char *)0x0) {
    CVar4 = Curl_urldecode(pSVar9,pcVar7,0,(char **)((long)(pSVar9->req).protop + 8),(size_t *)0x0,
                           true);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    pSVar9 = conn->data;
  }
  (pSVar9->req).size = -1;
  Curl_pgrsSetUploadCounter(pSVar9,0);
  Curl_pgrsSetDownloadCounter(pSVar9,0);
  Curl_pgrsSetUploadSize(pSVar9,-1);
  Curl_pgrsSetDownloadSize(pSVar9,-1);
  pSVar9 = conn->data;
  puVar1 = (undefined4 *)(pSVar9->req).protop;
  if ((pSVar9->set).opt_no_body == true) {
    *puVar1 = 1;
  }
  *done = false;
  pcVar2 = (pSVar9->set).mail_rcpt;
  *(curl_slist **)(puVar1 + 4) = pcVar2;
  if ((pcVar2 != (curl_slist *)0x0 & (pSVar9->set).upload) == 1) {
    pcVar7 = (pSVar9->set).str[0x25];
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (*Curl_cstrdup)("<>");
    }
    else {
      if (*pcVar7 == '<') {
        pcVar7 = "%s";
      }
      else {
        pcVar7 = "<%s>";
      }
      pcVar7 = curl_maprintf(pcVar7);
    }
    if (pcVar7 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar5 = (pSVar9->set).str[0x26];
    if ((pcVar5 == (char *)0x0) || ((conn->proto).imapc.cmdid == 0)) {
      pcVar5 = (char *)0x0;
    }
    else {
      if (*pcVar5 == '\0') {
        pcVar5 = (*Curl_cstrdup)("<>");
      }
      else {
        pcVar5 = curl_maprintf("%s");
      }
      if (pcVar5 == (char *)0x0) {
        (*Curl_cfree)(pcVar7);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    pp = &conn->proto;
    if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (conn->data->state).infilesize)) {
      local_48 = curl_maprintf("%ld",(pSVar9->state).infilesize);
      if (local_48 == (char *)0x0) {
        (*Curl_cfree)(pcVar7);
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (*Curl_cfree)(pcVar5);
        return CURLE_OUT_OF_MEMORY;
      }
      if (pcVar5 == (char *)0x0) {
        bVar8 = false;
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s SIZE=%s",pcVar7,local_48);
        bVar3 = true;
      }
      else {
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s SIZE=%s",pcVar7,pcVar5,local_48);
        bVar3 = true;
        bVar8 = true;
      }
    }
    else {
      if (pcVar5 == (char *)0x0) {
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s",pcVar7);
      }
      else {
        CVar4 = Curl_pp_sendf(&(pp->ftpc).pp,"MAIL FROM:%s AUTH=%s",pcVar7,pcVar5);
      }
      bVar3 = false;
      bVar8 = pcVar5 != (char *)0x0;
      local_48 = (char *)0x0;
    }
    (*Curl_cfree)(pcVar7);
    if (bVar8) {
      (*Curl_cfree)(pcVar5);
    }
    if (bVar3) {
      (*Curl_cfree)(local_48);
    }
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    (conn->proto).imapc.state = IMAP_SELECT;
  }
  else {
    CVar4 = smtp_perform_command(conn);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  p_Var6 = done;
  CVar4 = smtp_multi_statemach(conn,done);
  if ((CVar4 == CURLE_OK) && (CVar4 = CURLE_OK, *done == true)) {
    smtp_dophase_done(conn,SUB81(p_Var6,0));
  }
  return CVar4;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}